

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_extension_operator.cpp
# Opt level: O1

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalExtensionOperator::Deserialize
          (LogicalExtensionOperator *this,Deserializer *deserializer)

{
  pointer puVar1;
  int iVar2;
  ClientContext *context;
  DBConfig *pDVar3;
  pointer pOVar4;
  SerializationException *this_00;
  _Alloc_hider _Var5;
  pointer this_01;
  bool bVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> extension_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  Deserializer *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  context = Deserializer::Get<duckdb::ClientContext&>(deserializer);
  pDVar3 = DBConfig::GetConfig(context);
  (*deserializer->_vptr_Deserializer[2])(deserializer,200,"extension_name");
  (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
  local_58 = deserializer;
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  this_01 = (pDVar3->operator_extensions).
            super_vector<duckdb::unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (pDVar3->operator_extensions).
           super_vector<duckdb::unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  _Var5._M_p = (pointer)(this->super_LogicalOperator)._vptr_LogicalOperator;
  if (this_01 != puVar1) {
    do {
      pOVar4 = unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>
               ::operator->(this_01);
      (*(code *)**(undefined8 **)pOVar4)(&local_78,pOVar4);
      if (local_78._M_string_length == local_50._M_string_length) {
        if (local_78._M_string_length == 0) {
          bVar6 = true;
        }
        else {
          iVar2 = bcmp(local_78._M_dataplus._M_p,local_50._M_dataplus._M_p,local_78._M_string_length
                      );
          bVar6 = iVar2 == 0;
        }
      }
      else {
        bVar6 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      if (bVar6) {
        pOVar4 = unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>
                 ::operator->(this_01);
        (**(code **)(*(long *)pOVar4 + 8))(&local_78,pOVar4,local_58);
        _Var5._M_p = local_78._M_dataplus._M_p;
        if (bVar6) {
          (this->super_LogicalOperator)._vptr_LogicalOperator =
               (_func_int **)local_78._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 )(unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                   )this;
        }
      }
      this_01 = this_01 + 1;
    } while (this_01 != puVar1);
  }
  (this->super_LogicalOperator)._vptr_LogicalOperator = (_func_int **)_Var5._M_p;
  this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
  ::std::operator+(&local_78,"No deserialization method exists for extension: ",&local_50);
  SerializationException::SerializationException(this_00,&local_78);
  __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<LogicalOperator> LogicalExtensionOperator::Deserialize(Deserializer &deserializer) {
	auto &config = DBConfig::GetConfig(deserializer.Get<ClientContext &>());
	auto extension_name = deserializer.ReadProperty<string>(200, "extension_name");
	for (auto &extension : config.operator_extensions) {
		if (extension->GetName() == extension_name) {
			return extension->Deserialize(deserializer);
		}
	}
	throw SerializationException("No deserialization method exists for extension: " + extension_name);
}